

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xbox.cpp
# Opt level: O2

void * rw::xbox::createTexture(int32 width,int32 height,int32 numlevels,uint32 format)

{
  uint32 uVar1;
  uint32 uVar2;
  int32 *piVar3;
  undefined8 *puVar4;
  undefined4 in_register_00000014;
  ulong uVar5;
  uint uVar6;
  long lVar8;
  uint32 width_00;
  uint uVar9;
  int iVar10;
  int32 *piVar11;
  bool bVar12;
  uint uVar7;
  
  uVar5 = CONCAT44(in_register_00000014,numlevels);
  iVar10 = 0;
  uVar6 = 0;
  uVar2 = height;
  width_00 = width;
  uVar1 = format;
  uVar7 = 0;
  if (0 < numlevels) {
    uVar6 = numlevels;
    uVar7 = numlevels;
  }
  while (bVar12 = uVar6 != 0, uVar6 = uVar6 - 1, bVar12) {
    uVar1 = calculateTextureSize(width_00,uVar2,format,uVar1);
    iVar10 = iVar10 + uVar1;
    uVar9 = width_00 + 1;
    width_00 = (int)width_00 / 2;
    if (uVar9 < 3) {
      width_00 = 1;
    }
    uVar5 = (long)(int)uVar2 % 2 & 0xffffffff;
    uVar9 = uVar2 + 1;
    uVar2 = (int)uVar2 / 2;
    uVar1 = width_00;
    if (uVar9 < 3) {
      uVar2 = 1;
    }
  }
  puVar4 = &allocLocation;
  allocLocation =
       "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/d3d/xbox.cpp line: 504"
  ;
  piVar3 = (int32 *)(*DAT_00144da8)((long)(numlevels + -1) * 0x18 +
                                    (long)(int)(iVar10 + 3U & 0xfffffffc) + 0x20,0x30b00,uVar5);
  piVar11 = piVar3 + (long)(numlevels + -1) * 6 + 8;
  *piVar3 = numlevels;
  piVar3[1] = format;
  for (lVar8 = 0; (ulong)uVar7 * 0x18 - lVar8 != 0; lVar8 = lVar8 + 0x18) {
    *(int32 *)((long)piVar3 + lVar8 + 8) = width;
    *(int32 *)((long)piVar3 + lVar8 + 0xc) = height;
    *(int32 **)((long)piVar3 + lVar8 + 0x18) = piVar11;
    uVar2 = calculateTextureSize(width,height,format,(uint32)puVar4);
    *(uint32 *)((long)piVar3 + lVar8 + 0x10) = uVar2;
    piVar11 = (int32 *)((long)piVar11 + (long)(int)uVar2);
    uVar5 = (long)width / 2;
    if (width + 1U < 3) {
      uVar5 = 1;
    }
    puVar4 = (undefined8 *)(uVar5 & 0xffffffff);
    uVar2 = height / 2;
    if (height + 1U < 3) {
      uVar2 = 1;
    }
    width = (int32)uVar5;
    height = uVar2;
  }
  return piVar3;
}

Assistant:

static void*
createTexture(int32 width, int32 height, int32 numlevels, uint32 format)
{
	int32 w = width;
	int32 h = height;
	int32 size = 0;
	for(int32 i = 0; i < numlevels; i++){
		size += calculateTextureSize(w, h, 1, format);
		w /= 2;
		if(w == 0) w = 1;
		h /= 2;
		if(h == 0) h = 1;
	}
	size = (size+3)&~3;
	uint8 *data = (uint8*)rwNew(sizeof(RasterLevels)+sizeof(RasterLevels::Level)*(numlevels-1)+size,
		MEMDUR_EVENT | ID_DRIVER);
	RasterLevels *levels = (RasterLevels*)data;
	data += sizeof(RasterLevels)+sizeof(RasterLevels::Level)*(numlevels-1);
	levels->numlevels = numlevels;
	levels->format = format;
	w = width;
	h = height;
	for(int32 i = 0; i < numlevels; i++){
		levels->levels[i].width = w;
		levels->levels[i].height = h;
		levels->levels[i].data = data;
		levels->levels[i].size = calculateTextureSize(w, h, 1, format);
		data += levels->levels[i].size;
		w /= 2;
		if(w == 0) w = 1;
		h /= 2;
		if(h == 0) h = 1;
	}
	return levels;
}